

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O2

void disruptor::test::SequenceBarrier::WaitForCursor_invoker(void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  basic_wrap_stringstream<char> local_430;
  pointer local_298;
  pointer local_290;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  pointer local_270;
  pointer local_268;
  pointer local_260;
  pointer local_258;
  pointer local_250;
  WaitForCursor t;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_438 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"WaitForCursor");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_258 = (pbVar2->_M_dataplus)._M_p;
  local_250 = local_258 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_440,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  SequenceBarrierFixture::SequenceBarrierFixture(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_448 = "";
  memset(&local_430,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_430);
  std::operator<<((ostream *)&local_430,'\"');
  std::operator<<((ostream *)&local_430,"WaitForCursor");
  std::operator<<((ostream *)&local_430,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_430);
  local_268 = (pbVar2->_M_dataplus)._M_p;
  local_260 = local_268 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_450,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_430);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_458 = "";
  memset(&local_430,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_430);
  std::operator<<((ostream *)&local_430,'\"');
  std::operator<<((ostream *)&local_430,"WaitForCursor");
  std::operator<<((ostream *)&local_430,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_430);
  local_278 = (pbVar2->_M_dataplus)._M_p;
  local_270 = local_278 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_460,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_430);
  WaitForCursor::test_method(&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_468 = "";
  memset(&local_430,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_430);
  std::operator<<((ostream *)&local_430,'\"');
  std::operator<<((ostream *)&local_430,"WaitForCursor");
  std::operator<<((ostream *)&local_430,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_430);
  local_288 = (pbVar2->_M_dataplus)._M_p;
  local_280 = local_288 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_470,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_430);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_478 = "";
  memset(&local_430,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_430);
  std::operator<<((ostream *)&local_430,'\"');
  std::operator<<((ostream *)&local_430,"WaitForCursor");
  std::operator<<((ostream *)&local_430,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_430);
  local_298 = (pbVar2->_M_dataplus)._M_p;
  local_290 = local_298 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x3f);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_430);
  SequenceBarrierFixture::~SequenceBarrierFixture(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(barrier.WaitFor(kFirstSequenceValue));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);

  std::thread waiter2([this, &return_value]() {
    return_value.store(
        barrier.WaitFor(kFirstSequenceValue + 1L, std::chrono::seconds(5)));
  });

  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();

  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue + 1L);
}